

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCCollisionTree.cpp
# Opt level: O3

int __thiscall chrono::collision::ChCollisionTree::BuildModel(ChCollisionTree *this,double envelope)

{
  ChGeometry *pCVar1;
  
  if (this->build_state != ChC_BUILD_STATE_PROCESSED) {
    if (this->num_geometries == 0) {
      pCVar1 = (ChGeometry *)0x0;
    }
    else {
      pCVar1 = *(this->geometries).
                super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    this->last_geometry = pCVar1;
  }
  return 0;
}

Assistant:

int ChCollisionTree::BuildModel(double envelope) {
    if (build_state == ChC_BUILD_STATE_PROCESSED) {
        // fprintf(stderr,"Warning! Called EndModel() on ChCollisionTree \n"
        //               "object that was already ended. EndModel() was\n"
        //               "ignored.  Must do a BeginModel() to clear the\n"
        //               "model for addition of new triangles\n");
        return ChC_OK;
    }

    if (num_geometries)
        last_geometry = *geometries.begin();
    else
        last_geometry = NULL;

    return ChC_OK;
}